

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void duckdb::GenerateKeysInternal<true>
               (ArenaAllocator *allocator,DataChunk *input,unsafe_vector<ARTKey> *keys)

{
  PhysicalType PVar1;
  idx_t iVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  reference pvVar5;
  idx_t iVar6;
  InternalException *pIVar7;
  idx_t i;
  idx_t iVar8;
  uint64_t in_R8;
  long lVar9;
  ulong __n;
  string_t value;
  hugeint_t value_00;
  uhugeint_t value_01;
  hugeint_t value_02;
  string_t value_03;
  uhugeint_t value_04;
  ARTKey local_98;
  UnifiedVectorFormat data;
  
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  PVar1 = (pvVar5->type).physical_type_;
  switch(PVar1) {
  case BOOL:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<bool>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 (bool)pdVar4[iVar6]);
      lVar9 = lVar9 + 0x10;
    }
    break;
  case UINT8:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<unsigned_char>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),pdVar4[iVar6]);
      lVar9 = lVar9 + 0x10;
    }
    break;
  case INT8:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<signed_char>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),pdVar4[iVar6]);
      lVar9 = lVar9 + 0x10;
    }
    break;
  case UINT16:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<unsigned_short>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(unsigned_short *)(pdVar4 + iVar6 * 2));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case INT16:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<short>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(short *)(pdVar4 + iVar6 * 2));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case UINT32:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<unsigned_int>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(uint *)(pdVar4 + iVar6 * 4));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case INT32:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<int>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(int *)(pdVar4 + iVar6 * 4));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case UINT64:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<unsigned_long>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(unsigned_long *)(pdVar4 + iVar6 * 8));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case INT64:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<long>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(long *)(pdVar4 + iVar6 * 8));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case UINT64|UINT8:
switchD_009fe0c4_caseD_a:
    pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&data,"Invalid type for index",(allocator *)&local_98);
    InternalException::InternalException(pIVar7,(string *)&data);
    __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<float>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(float *)(pdVar4 + iVar6 * 4));
      lVar9 = lVar9 + 0x10;
    }
    break;
  case DOUBLE:
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    iVar2 = input->count;
    UnifiedVectorFormat::UnifiedVectorFormat(&data);
    Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
    pdVar4 = data.data;
    lVar9 = 0;
    for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
      iVar6 = iVar8;
      if ((data.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
      }
      ARTKey::CreateARTKey<double>
                (allocator,
                 (ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                 *(double *)(pdVar4 + iVar6 * 8));
      lVar9 = lVar9 + 0x10;
    }
    break;
  default:
    if (PVar1 == VARCHAR) {
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        value_03.value.pointer.ptr = (char *)in_R8;
        value_03.value._0_8_ = *(undefined8 *)(pdVar4 + iVar6 * 0x10 + 8);
        ARTKey::CreateARTKey<duckdb::string_t>
                  ((ARTKey *)allocator,
                   (ArenaAllocator *)
                   ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                   *(ARTKey **)(pdVar4 + iVar6 * 0x10),value_03);
        lVar9 = lVar9 + 0x10;
      }
    }
    else if (PVar1 == UINT128) {
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        value_04.upper = in_R8;
        value_04.lower = *(uint64_t *)(pdVar4 + iVar6 * 0x10 + 8);
        ARTKey::CreateARTKey<duckdb::uhugeint_t>
                  ((ARTKey *)allocator,
                   (ArenaAllocator *)
                   ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                   *(ARTKey **)(pdVar4 + iVar6 * 0x10),value_04);
        lVar9 = lVar9 + 0x10;
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_009fe0c4_caseD_a;
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        value_02.upper = in_R8;
        value_02.lower = *(uint64_t *)(pdVar4 + iVar6 * 0x10 + 8);
        ARTKey::CreateARTKey<duckdb::hugeint_t>
                  ((ARTKey *)allocator,
                   (ArenaAllocator *)
                   ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar9),
                   *(ARTKey **)(pdVar4 + iVar6 * 0x10),value_02);
        lVar9 = lVar9 + 0x10;
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&data);
  __n = 1;
  do {
    if ((ulong)(((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= __n) {
      return;
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    PVar1 = (pvVar5->type).physical_type_;
    switch(PVar1) {
    case BOOL:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<bool>(allocator,(bool)pdVar4[iVar6]);
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case UINT8:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<unsigned_char>(allocator,pdVar4[iVar6]);
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case INT8:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<signed_char>(allocator,pdVar4[iVar6]);
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case UINT16:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<unsigned_short>
                             (allocator,*(unsigned_short *)(pdVar4 + iVar6 * 2));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case INT16:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<short>(allocator,*(short *)(pdVar4 + iVar6 * 2));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case UINT32:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<unsigned_int>(allocator,*(uint *)(pdVar4 + iVar6 * 4));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case INT32:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<int>(allocator,*(int *)(pdVar4 + iVar6 * 4));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case UINT64:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<unsigned_long>
                             (allocator,*(unsigned_long *)(pdVar4 + iVar6 * 8));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case INT64:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<long>(allocator,*(long *)(pdVar4 + iVar6 * 8));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case UINT64|UINT8:
switchD_009fe75d_caseD_a:
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&data,"Invalid type for index",(allocator *)&local_98);
      InternalException::InternalException(pIVar7,(string *)&data);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<float>(allocator,*(float *)(pdVar4 + iVar6 * 4));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    case DOUBLE:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
      iVar2 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat(&data);
      Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
      pdVar4 = data.data;
      lVar9 = 0;
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar8;
        if ((data.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
        }
        local_98 = ARTKey::CreateARTKey<double>(allocator,*(double *)(pdVar4 + iVar6 * 8));
        ARTKey::Concat((ARTKey *)
                       ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                ).
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator,
                       &local_98);
        lVar9 = lVar9 + 0x10;
      }
      break;
    default:
      if (PVar1 == VARCHAR) {
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
        iVar2 = input->count;
        UnifiedVectorFormat::UnifiedVectorFormat(&data);
        Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
        pdVar4 = data.data;
        lVar9 = 0;
        for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
          psVar3 = (data.sel)->sel_vector;
          iVar6 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar6 = (idx_t)psVar3[iVar8];
          }
          value.value.pointer.ptr = (char *)psVar3;
          value.value._0_8_ = *(undefined8 *)(pdVar4 + iVar6 * 0x10 + 8);
          local_98 = ARTKey::CreateARTKey<duckdb::string_t>
                               ((ARTKey *)allocator,*(ArenaAllocator **)(pdVar4 + iVar6 * 0x10),
                                value);
          ARTKey::Concat((ARTKey *)
                         ((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator
                         ,&local_98);
          lVar9 = lVar9 + 0x10;
        }
      }
      else if (PVar1 == UINT128) {
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
        iVar2 = input->count;
        UnifiedVectorFormat::UnifiedVectorFormat(&data);
        Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
        pdVar4 = data.data;
        lVar9 = 0;
        for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
          iVar6 = iVar8;
          if ((data.sel)->sel_vector != (sel_t *)0x0) {
            iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
          }
          value_01.upper = *(uint64_t *)(pdVar4 + iVar6 * 0x10 + 8);
          value_01.lower = *(uint64_t *)(pdVar4 + iVar6 * 0x10);
          local_98 = ARTKey::CreateARTKey<duckdb::uhugeint_t>(allocator,value_01);
          ARTKey::Concat((ARTKey *)
                         ((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator
                         ,&local_98);
          lVar9 = lVar9 + 0x10;
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_009fe75d_caseD_a;
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
        iVar2 = input->count;
        UnifiedVectorFormat::UnifiedVectorFormat(&data);
        Vector::ToUnifiedFormat(pvVar5,iVar2,&data);
        pdVar4 = data.data;
        lVar9 = 0;
        for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
          iVar6 = iVar8;
          if ((data.sel)->sel_vector != (sel_t *)0x0) {
            iVar6 = (idx_t)(data.sel)->sel_vector[iVar8];
          }
          value_00.upper = *(int64_t *)(pdVar4 + iVar6 * 0x10 + 8);
          value_00.lower = *(uint64_t *)(pdVar4 + iVar6 * 0x10);
          local_98 = ARTKey::CreateARTKey<duckdb::hugeint_t>(allocator,value_00);
          ARTKey::Concat((ARTKey *)
                         ((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar9),allocator
                         ,&local_98);
          lVar9 = lVar9 + 0x10;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&data);
    __n = __n + 1;
  } while( true );
}

Assistant:

void GenerateKeysInternal(ArenaAllocator &allocator, DataChunk &input, unsafe_vector<ARTKey> &keys) {
	switch (input.data[0].GetType().InternalType()) {
	case PhysicalType::BOOL:
		TemplatedGenerateKeys<bool, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT8:
		TemplatedGenerateKeys<int8_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT16:
		TemplatedGenerateKeys<int16_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT32:
		TemplatedGenerateKeys<int32_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT64:
		TemplatedGenerateKeys<int64_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT128:
		TemplatedGenerateKeys<hugeint_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT8:
		TemplatedGenerateKeys<uint8_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT16:
		TemplatedGenerateKeys<uint16_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT32:
		TemplatedGenerateKeys<uint32_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT64:
		TemplatedGenerateKeys<uint64_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT128:
		TemplatedGenerateKeys<uhugeint_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::FLOAT:
		TemplatedGenerateKeys<float, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGenerateKeys<double, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::VARCHAR:
		TemplatedGenerateKeys<string_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	default:
		throw InternalException("Invalid type for index");
	}

	// We concatenate the keys for each remaining column of a compound key.
	for (idx_t i = 1; i < input.ColumnCount(); i++) {
		switch (input.data[i].GetType().InternalType()) {
		case PhysicalType::BOOL:
			ConcatenateKeys<bool, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT8:
			ConcatenateKeys<int8_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT16:
			ConcatenateKeys<int16_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT32:
			ConcatenateKeys<int32_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT64:
			ConcatenateKeys<int64_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT128:
			ConcatenateKeys<hugeint_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT8:
			ConcatenateKeys<uint8_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT16:
			ConcatenateKeys<uint16_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT32:
			ConcatenateKeys<uint32_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT64:
			ConcatenateKeys<uint64_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT128:
			ConcatenateKeys<uhugeint_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::FLOAT:
			ConcatenateKeys<float, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::DOUBLE:
			ConcatenateKeys<double, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::VARCHAR:
			ConcatenateKeys<string_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		default:
			throw InternalException("Invalid type for index");
		}
	}
}